

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_x25519_asn1.cc
# Opt level: O3

int x25519_get_pub_raw(EVP_PKEY *pkey,uint8_t *out,size_t *out_len)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  if (out != (uint8_t *)0x0) {
    if (*out_len < 0x20) {
      ERR_put_error(6,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_x25519_asn1.cc"
                    ,0x68);
      return 0;
    }
    puVar1 = (undefined8 *)pkey->pkey;
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    uVar4 = puVar1[3];
    *(undefined8 *)(out + 0x10) = puVar1[2];
    *(undefined8 *)(out + 0x18) = uVar4;
    *(undefined8 *)out = uVar2;
    *(undefined8 *)(out + 8) = uVar3;
  }
  *out_len = 0x20;
  return 1;
}

Assistant:

static int x25519_get_pub_raw(const EVP_PKEY *pkey, uint8_t *out,
                              size_t *out_len) {
  const X25519_KEY *key = reinterpret_cast<X25519_KEY *>(pkey->pkey);
  if (out == NULL) {
    *out_len = 32;
    return 1;
  }

  if (*out_len < 32) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  OPENSSL_memcpy(out, key->pub, 32);
  *out_len = 32;
  return 1;
}